

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O0

void fld_scale(limb_t *res,limb_t *e,limb_t s)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  llimb_t carry;
  limb_t s_local;
  limb_t *e_local;
  limb_t *res_local;
  
  uVar1 = s * *e;
  lVar4 = SUB168(SEXT816(s) * SEXT816(*e),8);
  *res = uVar1 & 0x7ffffffffffff;
  uVar1 = lVar4 << 0xd | uVar1 >> 0x33;
  uVar2 = s * e[1];
  uVar5 = uVar1 + uVar2;
  lVar4 = (lVar4 >> 0x33) + SUB168(SEXT816(s) * SEXT816(e[1]),8) + (ulong)CARRY8(uVar1,uVar2);
  res[1] = uVar5 & 0x7ffffffffffff;
  uVar1 = lVar4 * 0x2000 | uVar5 >> 0x33;
  uVar2 = s * e[2];
  uVar5 = uVar1 + uVar2;
  lVar4 = (lVar4 >> 0x33) + SUB168(SEXT816(s) * SEXT816(e[2]),8) + (ulong)CARRY8(uVar1,uVar2);
  res[2] = uVar5 & 0x7ffffffffffff;
  uVar1 = lVar4 * 0x2000 | uVar5 >> 0x33;
  uVar2 = s * e[3];
  uVar5 = uVar1 + uVar2;
  lVar3 = (lVar4 >> 0x33) + SUB168(SEXT816(s) * SEXT816(e[3]),8) + (ulong)CARRY8(uVar1,uVar2);
  res[3] = uVar5 & 0x7ffffffffffff;
  uVar1 = lVar3 * 0x2000 | uVar5 >> 0x33;
  lVar4 = e[4];
  uVar2 = s * lVar4;
  uVar5 = uVar1 + uVar2;
  res[4] = uVar5 & 0x7ffffffffffff;
  *res = *res + (((lVar3 >> 0x33) + SUB168(SEXT816(s) * SEXT816(lVar4),8) +
                 (ulong)CARRY8(uVar1,uVar2)) * 0x2000 | uVar5 >> 0x33) * 0x13;
  return;
}

Assistant:

void
fld_scale(fld_t res, const fld_t e, limb_t s)
{
	llimb_t carry;

	carry = (llimb_t)s*e[0];
	res[0] = carry & FLD_LIMB_MASK;

	carry = (carry >> FLD_LIMB_BITS) + (llimb_t)s*e[1];
	res[1] = carry & FLD_LIMB_MASK;

	carry = (carry >> FLD_LIMB_BITS) + (llimb_t)s*e[2];
	res[2] = carry & FLD_LIMB_MASK;

	carry = (carry >> FLD_LIMB_BITS) + (llimb_t)s*e[3];
	res[3] = carry & FLD_LIMB_MASK;

	carry = (carry >> FLD_LIMB_BITS) + (llimb_t)s*e[4];
	res[4] = carry & FLD_LIMB_MASK;

	res[0] += 19*(carry >> FLD_LIMB_BITS);
}